

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_access_block_grid_ptr(Integer g_a,Integer *index,void *ptr,Integer *ld)

{
  global_array_t *pgVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  global_array_t *pgVar5;
  global_array_t *pgVar6;
  long *plVar7;
  Integer *pIVar8;
  long lVar9;
  Integer *pIVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long *plVar17;
  ulong uVar18;
  long *plVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  C_Integer CVar23;
  long lVar24;
  ulong uVar25;
  short *psVar26;
  Integer proc_index [7];
  Integer lld [7];
  Integer ldims [7];
  Integer ldidx [7];
  Integer block_idx [7];
  Integer block_count [7];
  Integer *local_1d0;
  long local_1c8 [8];
  short *local_188;
  long local_180;
  long local_178;
  long local_170;
  long alStack_168 [8];
  long alStack_128 [8];
  long alStack_e8 [8];
  long alStack_a8 [8];
  long alStack_68 [7];
  
  lVar22 = g_a + 1000;
  pIVar8 = index;
  if (2 < GA[g_a + 1000].distr_type - 2U) {
    pIVar8 = (Integer *)0x0;
    pnga_error("Array is not using ScaLAPACK or tiled data distribution",0);
  }
  pgVar5 = GA;
  pgVar1 = GA + lVar22;
  local_1d0 = (Integer *)(lVar22 * 0x368);
  sVar2 = GA[lVar22].ndim;
  uVar25 = (ulong)sVar2;
  if (0 < (long)uVar25) {
    uVar12 = 0;
    do {
      pIVar8 = (Integer *)index[uVar12];
      if (((long)pIVar8 < 0) || (pgVar1->num_blocks[uVar12] <= (long)pIVar8)) {
        pnga_error("block index outside allowed values",(Integer)pIVar8);
      }
      uVar12 = uVar12 + 1;
    } while (uVar25 != uVar12);
  }
  pgVar6 = GA;
  plVar7 = (long *)((long)local_1d0 + (long)(pgVar5->dims + 0x3f));
  psVar26 = (short *)((long)local_1d0 + (long)(GA->dims + -6));
  iVar14 = *(int *)((long)&GA->distr_type + (long)local_1d0);
  if (iVar14 == 2) {
    sVar3 = *psVar26;
    uVar13 = (uint)sVar3;
    pIVar8 = (Integer *)(ulong)uVar13;
    if (0 < sVar3) {
      uVar12 = 0;
      do {
        local_1c8[uVar12] = index[uVar12] % (long)GA[g_a + 1000].nblock[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
    pIVar10 = (&local_1d0)[(int)uVar13];
    if (1 < sVar3) {
      uVar12 = (ulong)(uVar13 - 2);
      do {
        pIVar10 = (Integer *)
                  ((long)GA[g_a + 1000].nblock[uVar12] * (long)pIVar10 + local_1c8[uVar12]);
        bVar4 = 0 < (long)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar4);
    }
    local_1c8[0] = (long)pIVar10 % (long)*(int *)(psVar26 + 0x50);
    if (1 < sVar3) {
      lVar22 = 0;
      pIVar8 = pIVar10;
      do {
        pIVar8 = (Integer *)(((long)pIVar8 - local_1c8[0]) / (long)GA[g_a + 1000].nblock[lVar22]);
        local_1c8[0] = (long)pIVar8 % (long)GA[g_a + 1000].nblock[lVar22 + 1];
        local_1c8[lVar22 + 1] = local_1c8[0];
        lVar22 = lVar22 + 1;
      } while ((long)(int)uVar13 + -1 != lVar22);
    }
    if (1 < sVar2) {
      lVar22 = 0;
      do {
        lVar15 = pgVar5[g_a + 1000].block_dims[lVar22];
        lVar20 = pgVar5[g_a + 1000].nblock[lVar22] * lVar15;
        lVar9 = pgVar6[g_a + 1000].dims[lVar22];
        lVar11 = lVar9 % lVar20;
        pIVar8 = (Integer *)((lVar9 / lVar20) * lVar15);
        ld[lVar22] = (Integer)pIVar8;
        lVar9 = pgVar5[g_a + 1000].block_dims[lVar22];
        lVar20 = pgVar5[g_a + 1000].dims[lVar22];
        if (lVar11 < 1) {
LAB_0016eb38:
          lVar9 = lVar20 % lVar9;
        }
        else if (lVar11 / lVar15 <= local_1c8[lVar22]) {
          lVar20 = lVar11;
          if (local_1c8[lVar22] == lVar11 / lVar15) goto LAB_0016eb38;
          lVar9 = 0;
        }
        ld[lVar22] = lVar9 + (long)pIVar8;
        lVar22 = lVar22 + 1;
      } while (uVar25 - 1 != lVar22);
    }
  }
  else if (iVar14 == 4) {
    sVar3 = *psVar26;
    uVar13 = (uint)sVar3;
    if (0 < sVar3) {
      uVar12 = 0;
      do {
        local_1c8[uVar12] = index[uVar12] % (long)GA[g_a + 1000].nblock[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
    pIVar10 = (&local_1d0)[(int)uVar13];
    if (1 < sVar3) {
      uVar12 = (ulong)(uVar13 - 2);
      do {
        pIVar10 = (Integer *)
                  ((long)GA[g_a + 1000].nblock[uVar12] * (long)pIVar10 + local_1c8[uVar12]);
        bVar4 = 0 < (long)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar4);
    }
    local_1c8[0] = (long)pIVar10 % (long)*(int *)(psVar26 + 0x50);
    if (1 < sVar3) {
      lVar22 = 0;
      pIVar8 = pIVar10;
      do {
        pIVar8 = (Integer *)(((long)pIVar8 - local_1c8[0]) / (long)GA[g_a + 1000].nblock[lVar22]);
        local_1c8[0] = (long)pIVar8 % (long)GA[g_a + 1000].nblock[lVar22 + 1];
        local_1c8[lVar22 + 1] = local_1c8[0];
        lVar22 = lVar22 + 1;
      } while ((long)(int)uVar13 + -1 != lVar22);
    }
    if (sVar2 < 1) {
      pIVar8 = (Integer *)0x0;
    }
    else {
      local_188 = psVar26;
      lVar22 = uVar25 - 1;
      lVar15 = *(long *)((long)&GA->mapc + (long)local_1d0);
      local_180 = lVar15 + 8;
      uVar12 = 0;
      pIVar8 = (Integer *)0x0;
      local_170 = lVar22;
      local_178 = lVar15;
      do {
        alStack_168[uVar12] = 0;
        alStack_e8[uVar12] = 0;
        lVar20 = index[uVar12];
        lVar9 = lVar15 + (long)pIVar8 * 8;
        lVar11 = pgVar1->num_blocks[uVar12];
        if (lVar20 < lVar11 + -1) {
          CVar23 = *(long *)(lVar9 + 8 + lVar20 * 8) + -1;
        }
        else {
          CVar23 = pgVar1->dims[uVar12];
        }
        lVar24 = (CVar23 - *(long *)(lVar9 + lVar20 * 8)) + 1;
        alStack_128[uVar12] = lVar24;
        lVar9 = local_1c8[uVar12];
        if (lVar9 < lVar11) {
          iVar14 = pgVar1->nblock[uVar12];
          lVar15 = alStack_168[uVar12];
          lVar22 = local_180 + (long)pIVar8 * 8;
          do {
            if (lVar9 < lVar11 + -1) {
              CVar23 = *(long *)(lVar22 + lVar9 * 8) + -1;
            }
            else {
              CVar23 = pgVar1->dims[uVar12];
            }
            lVar21 = CVar23 - *(long *)(lVar22 + -8 + lVar9 * 8);
            if (lVar9 < lVar20) {
              alStack_e8[uVar12] = alStack_e8[uVar12] + lVar21 + 1;
            }
            lVar15 = lVar15 + lVar21 + 1;
            lVar9 = lVar9 + iVar14;
          } while (lVar9 < lVar11);
          alStack_168[uVar12] = lVar15;
          lVar15 = local_178;
          lVar22 = local_170;
        }
        if ((long)uVar12 < lVar22) {
          ld[uVar12] = lVar24;
        }
        pIVar8 = (Integer *)((long)pIVar8 + pgVar1->num_blocks[uVar12]);
        uVar12 = uVar12 + 1;
        psVar26 = local_188;
      } while (uVar12 != uVar25);
    }
  }
  else {
    pIVar10 = local_1d0;
    if (iVar14 == 3) {
      sVar3 = *psVar26;
      uVar13 = (uint)sVar3;
      pIVar8 = (Integer *)(ulong)uVar13;
      if (0 < sVar3) {
        uVar12 = 0;
        do {
          local_1c8[uVar12] = index[uVar12] % (long)GA[g_a + 1000].nblock[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
      pIVar10 = (&local_1d0)[(int)uVar13];
      if (1 < sVar3) {
        uVar12 = (ulong)(uVar13 - 2);
        do {
          pIVar10 = (Integer *)
                    ((long)GA[g_a + 1000].nblock[uVar12] * (long)pIVar10 + local_1c8[uVar12]);
          bVar4 = 0 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar4);
      }
      local_1c8[0] = (long)pIVar10 % (long)*(int *)(psVar26 + 0x50);
      if (1 < sVar3) {
        lVar22 = 0;
        pIVar8 = pIVar10;
        do {
          pIVar8 = (Integer *)(((long)pIVar8 - local_1c8[0]) / (long)GA[g_a + 1000].nblock[lVar22]);
          local_1c8[0] = (long)pIVar8 % (long)GA[g_a + 1000].nblock[lVar22 + 1];
          local_1c8[lVar22 + 1] = local_1c8[0];
          lVar22 = lVar22 + 1;
        } while ((long)(int)uVar13 + -1 != lVar22);
      }
      if (0 < sVar2) {
        uVar12 = 0;
        do {
          lVar22 = *(long *)((long)local_1d0 + (long)(pgVar5->dims + uVar12));
          lVar15 = (index[uVar12] + 1) * plVar7[uVar12];
          if (lVar22 <= lVar15) {
            lVar15 = lVar22;
          }
          pIVar8 = (Integer *)(lVar15 - plVar7[uVar12] * index[uVar12]);
          alStack_128[uVar12] = (long)pIVar8;
          if ((long)uVar12 < (long)(uVar25 - 1)) {
            ld[uVar12] = (Integer)pIVar8;
          }
          uVar12 = uVar12 + 1;
        } while (uVar25 != uVar12);
      }
    }
  }
  iVar14 = *(int *)((long)&pgVar6->distr_type + (long)local_1d0);
  if (iVar14 == 4) {
    if (0 < sVar2) {
      uVar12 = 0;
      pIVar8 = (Integer *)0x0;
      do {
        lVar22 = 1;
        if (uVar12 != 0) {
          uVar18 = 0;
          do {
            lVar22 = lVar22 * alStack_168[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar12 != uVar18);
        }
        lVar22 = lVar22 * alStack_e8[uVar12];
        uVar12 = uVar12 + 1;
        for (uVar18 = uVar12; (long)uVar18 < (long)uVar25; uVar18 = uVar18 + 1) {
          lVar22 = lVar22 * alStack_128[uVar18];
        }
        pIVar8 = (Integer *)((long)pIVar8 + lVar22);
      } while (uVar12 != uVar25);
      goto LAB_0016ee50;
    }
  }
  else if (iVar14 == 3) {
    if (0 < sVar2) {
      uVar12 = 0;
      do {
        lVar20 = (long)pgVar5[g_a + 1000].nblock[uVar12];
        alStack_a8[uVar12] = ((index[uVar12] - local_1c8[uVar12]) + 1) / lVar20;
        lVar22 = pgVar5[g_a + 1000].block_dims[uVar12];
        lVar15 = (pgVar5[g_a + 1000].num_blocks[uVar12] - local_1c8[uVar12]) + 1;
        lVar9 = lVar15 / lVar20;
        iVar14 = (int)lVar9;
        if (lVar15 % lVar20 == 0) {
          lVar15 = pgVar5[g_a + 1000].dims[uVar12] % lVar22;
          lVar9 = lVar9 << 0x20;
          if (lVar15 == 0) {
            lVar9 = lVar9 >> 0x20;
            goto LAB_0016ed1e;
          }
          lVar22 = lVar22 * (lVar9 + -0x100000000 >> 0x20) + lVar15;
        }
        else {
          lVar9 = (long)iVar14;
LAB_0016ed1e:
          lVar22 = lVar22 * lVar9;
        }
        alStack_168[uVar12] = lVar22;
        alStack_68[uVar12] = (long)iVar14;
        uVar12 = uVar12 + 1;
      } while (uVar25 != uVar12);
    }
    if (0 < sVar2) {
      uVar12 = 0;
      pIVar8 = (Integer *)0x0;
      do {
        lVar22 = 1;
        plVar17 = plVar7;
        uVar18 = uVar12;
        if (uVar12 != 0) {
          uVar16 = 0;
          do {
            lVar22 = lVar22 * alStack_168[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
        do {
          plVar19 = plVar17;
          if ((uVar12 < uVar18) && (alStack_a8[uVar18] == alStack_68[uVar18] + -1)) {
            plVar19 = alStack_128 + uVar18;
          }
          lVar22 = lVar22 * *plVar19;
          uVar18 = uVar18 + 1;
          plVar17 = plVar17 + 1;
        } while ((long)uVar18 < (long)uVar25);
        pIVar8 = (Integer *)((long)pIVar8 + lVar22 * alStack_a8[uVar12]);
        uVar12 = uVar12 + 1;
        plVar7 = plVar7 + 1;
      } while (uVar12 != uVar25);
      goto LAB_0016ee50;
    }
  }
  else {
    if (iVar14 != 2) goto LAB_0016ee50;
    if (0 < sVar2) {
      uVar12 = 0;
      pIVar8 = (Integer *)0x0;
      lVar22 = 1;
      do {
        lVar15 = lVar22;
        if ((long)uVar12 < (long)(uVar25 - 1)) {
          lVar15 = ld[uVar12] * lVar22;
        }
        pIVar8 = (Integer *)
                 ((long)pIVar8 +
                 ((index[uVar12] - local_1c8[uVar12]) / (long)pgVar5[g_a + 1000].nblock[uVar12]) *
                 lVar22 * pgVar5[g_a + 1000].block_dims[uVar12]);
        uVar12 = uVar12 + 1;
        lVar22 = lVar15;
      } while (uVar25 != uVar12);
      goto LAB_0016ee50;
    }
  }
  pIVar8 = (Integer *)0x0;
LAB_0016ee50:
  *(long *)ptr = (long)*(int *)(psVar26 + 0xc) * (long)pIVar8 +
                 *(long *)(*(long *)(psVar26 + 0xf0) + (long)pIVar10 * 8);
  return;
}

Assistant:

void pnga_access_block_grid_ptr(Integer g_a, Integer *index, void* ptr, Integer *ld)
            /* g_a: array handle [input]
             * index: subscript of a particular block  [input]
             * ptr: pointer to data in block [output]
             * ld:  array of strides for block data [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  Integer  i/*, p_handle*/, offset, factor, inode;
  Integer ndim;
  C_Integer *num_blocks, *block_dims;
  int *proc_grid;
  Integer *dims;
  Integer last;
  Integer proc_index[MAXDIM];
  Integer blk_num[MAXDIM], blk_dim[MAXDIM], blk_inc[MAXDIM];
  Integer blk_ld[MAXDIM],hlf_blk[MAXDIM],blk_jinc;
  Integer j, lo, hi;
  Integer lld[MAXDIM], block_idx[MAXDIM], block_count[MAXDIM];
  Integer ldims[MAXDIM], ldidx[MAXDIM];
  Integer *mapc;

  
  /*p_handle = GA[handle].p_handle;*/
  if (GA[handle].distr_type != SCALAPACK && GA[handle].distr_type != TILED &&
      GA[handle].distr_type != TILED_IRREG) {
    pnga_error("Array is not using ScaLAPACK or tiled data distribution",0);
  }
  /* dimensions of processor grid */
  proc_grid = GA[handle].nblock;
  /* number of blocks along each dimension */
  num_blocks = GA[handle].num_blocks;
  /* size of individual blocks */
  block_dims = GA[handle].block_dims;
  dims = GA[handle].dims;
  ndim = GA[handle].ndim;
  for (i=0; i<ndim; i++) {
    if (index[i] < 0 || index[i] >= num_blocks[i])
      pnga_error("block index outside allowed values",index[i]);
  }

  /* Find strides of requested block */
  if (GA[handle].distr_type == TILED) {
    /* find out what processor block is located on */
    gam_find_tile_proc_from_indices(handle, inode, index)

    /* get proc indices of processor that owns block */
    gam_find_tile_proc_indices(handle,inode,proc_index)
      last = ndim-1;

    for (i=0; i<ndim; i++)  {
      lo = index[i]*block_dims[i]+1;
      hi = (index[i]+1)*block_dims[i];
      if (hi > dims[i]) hi = dims[i]; 
      ldims[i] = (hi - lo + 1);
      if (i<last) ld[i] = ldims[i];
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* find out what processor block is located on */
    gam_find_tile_proc_from_indices(handle, inode, index);

    /* get proc indices of processor that owns block */
    gam_find_tile_proc_indices(handle,inode,proc_index)
      last = ndim-1;

    mapc = GA[handle].mapc;
    offset = 0;
    for (i=0; i<ndim; i++) {
      lld[i] = 0;
      ldidx[i] = 0;
      lo = mapc[offset+index[i]];
      if (index[i] < num_blocks[i]-1) {
        hi = mapc[offset+index[i]+1]-1;
      } else {
        hi = dims[i];
      }
      ldims[i] = hi - lo + 1;
      for (j = proc_index[i]; j<num_blocks[i]; j += proc_grid[i]) {
        lo = mapc[offset+j];
        if (j < num_blocks[i]-1) {
          hi = mapc[offset+j+1]-1;
        } else {
          hi = dims[i];
        }
        lld[i] += (hi-lo+1);
        if (j < index[i]) {
          ldidx[i] += (hi-lo+1);
        }
      }
      if (i<last) ld[i] = ldims[i];
      offset += num_blocks[i];
    }
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* find out what processor block is located on */
    gam_find_proc_from_sl_indices(handle, inode, index);

    /* get proc indices of processor that owns block */
    gam_find_proc_indices(handle,inode,proc_index)
      last = ndim-1;
 
    for (i=0; i<last; i++)  {
      blk_dim[i] = block_dims[i]*proc_grid[i];
      blk_num[i] = GA[handle].dims[i]/blk_dim[i];
      blk_inc[i] = GA[handle].dims[i] - blk_num[i]*blk_dim[i];
      blk_ld[i] = blk_num[i]*block_dims[i];
      hlf_blk[i] = blk_inc[i]/block_dims[i];
      ld[i] = blk_ld[i];
      blk_jinc = dims[i]%block_dims[i];
      if (blk_inc[i] > 0) {
        if (proc_index[i]<hlf_blk[i]) {
          blk_jinc = block_dims[i];
        } else if (proc_index[i] == hlf_blk[i]) {
          blk_jinc = blk_inc[i]%block_dims[i];
          /*
          if (blk_jinc == 0) {
          blk_jinc = block_dims[i];
          }
          */
        } else {
          blk_jinc = 0;
        }
      }
      ld[i] += blk_jinc;
    }
  }

  /* Find the local grid index of block relative to local block grid and
     store result in block_idx.
     Find physical dimensions of locally held data and store in 
     lld and set values in ldim, which is used to evaluate the
     offset for the requested block. */
  if (GA[handle].distr_type == TILED) {
    for (i=0; i<ndim; i++) {
      int ldim;
      /*
      block_idx[i] = 0;
      block_count[i] = 0;
      lld[i] = 0;
      lo = 0;
      hi = -1;
      */
      block_idx[i] = (index[i]-proc_index[i]+1)/proc_grid[i];
      ldim = (num_blocks[i]-proc_index[i]+1)/proc_grid[i];
      if ((num_blocks[i]-proc_index[i]+1)%proc_grid[i] == 0) {
        if (dims[i]%block_dims[i] != 0) {
          lld[i] = (ldim-1)*block_dims[i] + dims[i]%block_dims[i];
        } else {
          lld[i] = ldim*block_dims[i];
        }
      } else {
        lld[i] = ldim *block_dims[i];
      }
      block_count[i] = ldim;
      /*
      for (j=proc_index[i]; j<num_blocks[i]; j += proc_grid[i]) {
        lo = j*block_dims[i] + 1;
        hi = (j+1)*block_dims[i];
        if (hi > dims[i]) hi = dims[i]; 
        lld[i] += (hi - lo + 1);
        if (j<index[i]) block_idx[i]++;
        block_count[i]++;
      }
      */
    }

    /* Evaluate offset for requested block. The algorithm used goes like this:
     *    The contribution from the fastest dimension is
     *      block_idx[0]*block_dims[0]*...*block_dims[ndim-1];
     *    The contribution from the second fastest dimension is
     *      block_idx[1]*lld[0]*block_dims[1]*...*block_dims[ndim-1];
     *    The contribution from the third fastest dimension is
     *      block_idx[2]*lld[0]*lld[1]*block_dims[2]*...*block_dims[ndim-1];
     *    etc.
     *    If block_idx[i] is equal to the total number of blocks contained on that
     *    processor minus 1 (the index is at the edge of the array) and the index
     *    i is greater than the index of the dimension, then instead of using the
     *    block dimension, use the fractional dimension of the edge block (which
     *    may be smaller than the block dimension)
     */
    offset = 0;
    for (i=0; i<ndim; i++) {
      factor = 1;
      for (j=0; j<i; j++) {
        factor *= lld[j];
      }
      for (j=i; j<ndim; j++) {
        if (j > i && block_idx[j] == block_count[j]-1) {
          factor *= ldims[j];
        } else {
          factor *= block_dims[j];
        }
      }
      offset += block_idx[i]*factor;
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* Evaluate offset for requested block. This algorithm is similar to the
     * algorithm for reqularly tiled data layouts.
     *    The contribution from the fastest dimension is
     *      ldidx[0]*ldims[2]*...*ldims[ndim-1];
     *    The contribution from the second fastest dimension is
     *      lld[0]*ldidx[1]*ldims[2]*...*ldims[ndim-1];
     *    The contribution from the third fastest dimension is
     *      lld[0]*lld[1]*ldidx[2]*ldims[3]*...*ldims[ndim-1];
     *    etc.
     */
    offset = 0;
    for (i=0; i<ndim; i++) {
      factor = 1;
      for (j=0; j<i; j++) {
        factor *= lld[j];
      }
      factor *= ldidx[i];
      for (j=i+1; j<ndim; j++) {
        factor *= ldims[j];
      }
      offset += factor;
    }
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* Evalauate offset for block */
    offset = 0;
    factor = 1;
    for (i = 0; i<ndim; i++) {
      offset += ((index[i]-proc_index[i])/proc_grid[i])*block_dims[i]*factor;
      if (i<ndim-1) factor *= ld[i];
    }
  }

  lptr = GA[handle].ptr[inode]+offset*GA[handle].elemsize;

  *(char**)ptr = lptr; 
}